

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# futex_wrapper_linux.hpp
# Opt level: O0

void Fossilize::futex_wrapper_lock(int *lock)

{
  int iVar1;
  int c;
  int *lock_local;
  
  iVar1 = cmpxchg(lock,0,1);
  while (iVar1 != 0) {
    if ((iVar1 == 2) || (iVar1 = cmpxchg(lock,1,2), iVar1 != 0)) {
      syscall(0xca,lock,0,2,0,0,0);
    }
    iVar1 = cmpxchg(lock,0,2);
  }
  return;
}

Assistant:

static inline void futex_wrapper_lock(int *lock)
{
	int c = cmpxchg(lock, 0, 1);
	if (c != 0)
	{
		// Contention.
		do
		{
			// Need to lock. Force *lock to be 2.
			if (c == 2 || cmpxchg(lock, 1, 2) != 0)
			{
				// If *lock is 2 (was not unlocked somehow by other thread),
				// wait until it's woken up.
				syscall(SYS_futex, lock, FUTEX_WAIT, 2, 0, 0, 0);
			}
		} while ((c = cmpxchg(lock, 0, 2)) != 0);
	}
}